

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void __thiscall
duckdb::AggregateExecutor::
UnaryScatter<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintSumOperation>
          (AggregateExecutor *this,Vector *input,Vector *states,AggregateInputData *aggr_input_data,
          idx_t count)

{
  undefined8 *puVar1;
  HugeintAdd *this_00;
  hugeint_t *idata_00;
  SumState<duckdb::hugeint_t> **states_00;
  undefined1 *puVar2;
  hugeint_t lhs;
  hugeint_t rhs;
  hugeint_t rhs_00;
  AggregateInputData *pAVar3;
  AggregateInputData *pAVar4;
  AggregateInputData *pAVar5;
  hugeint_t hVar6;
  hugeint_t input_00;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  uint64_t uVar7;
  long *in_stack_ffffffffffffff40;
  long *plVar8;
  uint64_t in_stack_ffffffffffffff48;
  long in_stack_ffffffffffffff50;
  int64_t iVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  uint64_t local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((*this == (AggregateExecutor)0x2) && (*input == (Vector)0x2)) {
    if ((*(byte **)(this + 0x28) == (byte *)0x0) || ((**(byte **)(this + 0x28) & 1) != 0)) {
      puVar1 = *(undefined8 **)(this + 0x20);
      this_00 = (HugeintAdd *)**(undefined8 **)(input + 0x20);
      *this_00 = (HugeintAdd)0x1;
      input_00.upper = (int64_t)aggr_input_data;
      input_00.lower = puVar1[1];
      HugeintAdd::AddConstant<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t>
                (this_00,(SumState<duckdb::hugeint_t> *)*puVar1,input_00,count);
      return;
    }
  }
  else {
    if (*this == (AggregateExecutor)0x0 && *input == (Vector)0x0) {
      idata_00 = *(hugeint_t **)(this + 0x20);
      states_00 = *(SumState<duckdb::hugeint_t> ***)(input + 0x20);
      FlatVector::VerifyFlatVector((Vector *)this);
      UnaryFlatLoop<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintSumOperation>
                (idata_00,(AggregateInputData *)states,states_00,(ValidityMask *)(this + 0x28),
                 (idx_t)aggr_input_data);
      return;
    }
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat
              ((UnifiedVectorFormat *)&stack0xffffffffffffff40);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)this,(UnifiedVectorFormat *)aggr_input_data);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)aggr_input_data);
    if (in_stack_ffffffffffffff50 == 0) {
      if (aggr_input_data != (AggregateInputData *)0x0) {
        pAVar5 = (AggregateInputData *)0x0;
        iVar9 = 0;
        uVar7 = local_70;
        do {
          pAVar3 = pAVar5;
          if (*local_78 != 0) {
            pAVar3 = (AggregateInputData *)(ulong)*(uint *)(*local_78 + (long)pAVar5 * 4);
          }
          puVar2 = *(undefined1 **)(uVar7 + (long)pAVar3 * 8);
          *puVar2 = 1;
          hVar6.upper = (int64_t)in_stack_ffffffffffffff40;
          hVar6.lower = uVar7;
          rhs_00.upper = iVar9;
          rhs_00.lower = in_stack_ffffffffffffff48;
          hVar6 = Hugeint::Add<true>(hVar6,rhs_00);
          *(hugeint_t *)(puVar2 + 8) = hVar6;
          pAVar5 = (AggregateInputData *)((long)&(pAVar5->bind_data).ptr + 1);
        } while (aggr_input_data != pAVar5);
      }
    }
    else if (aggr_input_data != (AggregateInputData *)0x0) {
      pAVar5 = (AggregateInputData *)0x0;
      uVar7 = local_70;
      plVar8 = in_stack_ffffffffffffff40;
      do {
        pAVar3 = pAVar5;
        if (*in_stack_ffffffffffffff40 != 0) {
          pAVar3 = (AggregateInputData *)
                   (ulong)*(uint *)(*in_stack_ffffffffffffff40 + (long)pAVar5 * 4);
        }
        pAVar4 = pAVar5;
        if (*local_78 != 0) {
          pAVar4 = (AggregateInputData *)(ulong)*(uint *)(*local_78 + (long)pAVar5 * 4);
        }
        if ((in_stack_ffffffffffffff50 == 0) ||
           ((*(ulong *)(in_stack_ffffffffffffff50 + ((ulong)pAVar3 >> 6) * 8) >>
             ((ulong)pAVar3 & 0x3f) & 1) != 0)) {
          puVar2 = *(undefined1 **)(uVar7 + (long)pAVar4 * 8);
          *puVar2 = 1;
          lhs.upper = (int64_t)plVar8;
          lhs.lower = uVar7;
          rhs.upper = in_stack_ffffffffffffff50;
          rhs.lower = in_stack_ffffffffffffff48;
          hVar6 = Hugeint::Add<true>(lhs,rhs);
          *(hugeint_t *)(puVar2 + 8) = hVar6;
        }
        pAVar5 = (AggregateInputData *)((long)&(pAVar5->bind_data).ptr + 1);
      } while (aggr_input_data != pAVar5);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}